

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree234.c
# Opt level: O2

void search234_step(search234_state *state,int direction)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  void *pvVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  
  pvVar5 = state->_node;
  if (pvVar5 == (void *)0x0) {
    state->element = (void *)0x0;
    iVar7 = 0;
LAB_0015bfc8:
    state->index = iVar7;
    return;
  }
  iVar7 = state->_last;
  if (iVar7 == -1) {
    state->_lo = 0;
  }
  else {
    if (direction == 0) {
      __assert_fail("direction",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/tree234.c"
                    ,0x27e,"void search234_step(search234_state *, int)");
    }
    if (direction < 1) {
      iVar7 = iVar7 + -1;
      state->_hi = iVar7;
      uVar6 = state->_lo;
    }
    else {
      uVar6 = iVar7 + 1;
      state->_lo = uVar6;
      iVar7 = state->_hi;
    }
    if ((int)uVar6 <= iVar7) goto LAB_0015c044;
    uVar3 = 0;
    uVar8 = 0;
    if (0 < (int)uVar6) {
      uVar8 = (ulong)uVar6;
    }
    for (; uVar8 != uVar3; uVar3 = uVar3 + 1) {
      state->_base = *(int *)((long)pvVar5 + uVar3 * 4 + 0x28) + state->_base + 1;
    }
    pvVar5 = *(void **)((long)pvVar5 + (long)(int)uVar6 * 8 + 8);
    state->_node = pvVar5;
    state->_last = -1;
    state->_lo = 0;
    if (pvVar5 == (void *)0x0) {
      state->_hi = 0;
      state->element = (void *)0x0;
      iVar7 = state->_base;
      goto LAB_0015bfc8;
    }
  }
  for (lVar4 = 0; iVar7 = 2, lVar4 != 3; lVar4 = lVar4 + 1) {
    if (*(long *)((long)pvVar5 + lVar4 * 8 + 0x38) == 0) {
      iVar7 = (int)lVar4 + -1;
      break;
    }
  }
  state->_hi = iVar7;
  uVar6 = 0;
LAB_0015c044:
  iVar1 = (int)(iVar7 + uVar6) / 2;
  state->_last = iVar1;
  state->element = *(void **)((long)pvVar5 + (long)iVar1 * 8 + 0x38);
  iVar2 = state->_base + iVar1;
  state->index = iVar2;
  iVar7 = -1;
  if (-1 < iVar1) {
    iVar7 = iVar1;
  }
  for (uVar3 = 0; iVar7 + 1 != uVar3; uVar3 = uVar3 + 1) {
    iVar2 = iVar2 + *(int *)((long)pvVar5 + uVar3 * 4 + 0x28);
    state->index = iVar2;
  }
  return;
}

Assistant:

void search234_step(search234_state *state, int direction)
{
    node234 *node = state->_node;
    int i;

    if (!node) {
        state->element = NULL;
        state->index = 0;
        return;
    }

    if (state->_last != -1) {
        /*
         * We're already pointing at some element of a node, so we
         * should restrict to the elements left or right of it,
         * depending on the requested search direction.
         */
        assert(direction);
        assert(node);

        if (direction > 0)
            state->_lo = state->_last + 1;
        else
            state->_hi = state->_last - 1;

        if (state->_lo > state->_hi) {
            /*
             * We've run out of elements in this node, i.e. we've
             * narrowed to nothing but a child pointer. Descend to
             * that child, and update _base to the leftmost index of
             * its subtree.
             */
            for (i = 0; i < state->_lo; i++)
                state->_base += 1 + node->counts[i];
            state->_node = node = node->kids[state->_lo];
            state->_last = -1;
        }
    }

    if (state->_last == -1) {
        /*
         * We've just entered a new node - either because of the above
         * code, or because we were called from search234_start - and
         * anything in that node is a viable answer.
         */
        state->_lo = 0;
        state->_hi = node ? elements234(node)-1 : 0;
    }

    /*
     * Now we've got something we can return.
     */
    if (!node) {
        state->element = NULL;
        state->index = state->_base;
    } else {
        state->_last = (state->_lo + state->_hi) / 2;
        state->element = node->elems[state->_last];
        state->index = state->_base + state->_last;
        for (i = 0; i <= state->_last; i++)
            state->index += node->counts[i];
    }
}